

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O0

void __thiscall CodeWriter::tag(CodeWriter *this,string *tag,bool isForEnd)

{
  bool isForEnd_local;
  string *tag_local;
  CodeWriter *this_local;
  
  std::__cxx11::string::operator+=((string *)this,(string *)tag);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->tab);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->nop);
  std::__cxx11::string::operator+=((string *)this,(string *)&this->newLine);
  return;
}

Assistant:

void CodeWriter::tag(const std::string &tag, bool isForEnd) {
    moonOutput += tag;
    moonOutput += tab;
    moonOutput += nop;
    moonOutput += newLine;
}